

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int ffi_callback_set(lua_State *L,GCfunc *fn)

{
  uint uVar1;
  GCcdata *pGVar2;
  long *plVar3;
  TValue *pTVar4;
  long in_RSI;
  long in_RDI;
  TValue *tv;
  GCtab *t;
  MSize slot;
  CType *ct;
  CTState *cts;
  GCcdata *cd;
  GCobj *o;
  CType *ct_1;
  CTState *cts_1;
  ErrMsg in_stack_fffffffffffffeec;
  lua_State *in_stack_fffffffffffffef0;
  CTState *in_stack_fffffffffffffef8;
  GCtab *t_00;
  undefined4 in_stack_ffffffffffffff08;
  uint *local_78;
  
  pGVar2 = ffi_checkcdata(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  plVar3 = (long *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0xfc);
  plVar3[2] = in_RDI;
  for (local_78 = (uint *)(*plVar3 + (ulong)pGVar2->ctypeid * 0x10); *local_78 >> 0x1c == 8;
      local_78 = (uint *)(*plVar3 + (ulong)(*local_78 & 0xffff) * 0x10)) {
  }
  if ((((*local_78 >> 0x1c == 2) && (local_78[1] == 8)) &&
      (uVar1 = lj_ccallback_ptr2slot(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0),
      uVar1 < *(uint *)(plVar3 + 0x19))) && (*(short *)(plVar3[0x18] + (ulong)uVar1 * 2) != 0)) {
    t_00 = (GCtab *)plVar3[5];
    if (uVar1 < t_00->asize) {
      pTVar4 = (TValue *)((ulong)(t_00->array).ptr32 + (long)(int)uVar1 * 8);
    }
    else {
      pTVar4 = lj_tab_setinth((lua_State *)CONCAT44(uVar1,in_stack_ffffffffffffff08),t_00,
                              (int32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    }
    if (in_RSI == 0) {
      (pTVar4->field_2).it = 0xffffffff;
      *(undefined2 *)(plVar3[0x18] + (ulong)uVar1 * 2) = 0;
      if (*(uint *)((long)plVar3 + 0xcc) <= uVar1) {
        uVar1 = *(uint *)((long)plVar3 + 0xcc);
      }
      *(uint *)((long)plVar3 + 0xcc) = uVar1;
    }
    else {
      (pTVar4->u32).lo = (uint32_t)in_RSI;
      (pTVar4->field_2).it = 0xfffffff7;
      if ((t_00->marked & 4) != 0) {
        uVar1 = *(uint *)(in_RDI + 8);
        t_00->marked = t_00->marked & 0xfb;
        (t_00->gclist).gcptr32 = *(uint32_t *)((ulong)uVar1 + 0x3c);
        *(int *)((ulong)uVar1 + 0x3c) = (int)t_00;
      }
    }
    return 0;
  }
  lj_err_caller(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
}

Assistant:

static int ffi_callback_set(lua_State *L, GCfunc *fn)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  if (ctype_isptr(ct->info) && (LJ_32 || ct->size == 8)) {
    MSize slot = lj_ccallback_ptr2slot(cts, *(void **)cdataptr(cd));
    if (slot < cts->cb.sizeid && cts->cb.cbid[slot] != 0) {
      GCtab *t = cts->miscmap;
      TValue *tv = lj_tab_setint(L, t, (int32_t)slot);
      if (fn) {
	setfuncV(L, tv, fn);
	lj_gc_anybarriert(L, t);
      } else {
	setnilV(tv);
	cts->cb.cbid[slot] = 0;
	cts->cb.topid = slot < cts->cb.topid ? slot : cts->cb.topid;
      }
      return 0;
    }
  }
  lj_err_caller(L, LJ_ERR_FFI_BADCBACK);
  return 0;
}